

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

int mctools_path_is_absolute(mcu8str *rawpath)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  mcu8str path;
  mcu8str local_28;
  
  pcVar2 = rawpath->c_str;
  uVar1 = rawpath->size;
  local_28.buflen = uVar1 + 1;
  local_28.owns_memory = 0;
  local_28.c_str = pcVar2;
  local_28.size = uVar1;
  iVar4 = mctools_impl_has_winnamespace(rawpath);
  if (iVar4 != 0) {
    local_28.c_str = pcVar2 + 4;
    local_28.size = uVar1 - 4;
  }
  pcVar2 = local_28.c_str;
  if (local_28.size != 0) {
    if ((local_28.size != 1) && (*local_28.c_str == '~')) {
      if (local_28.c_str[1] == '/') {
        return 1;
      }
      if (local_28.c_str[1] == '\\') {
        return 1;
      }
    }
    cVar3 = mctools_drive_letter(&local_28);
    local_28.size =
         (uint)(pcVar2[(ulong)(cVar3 != '\0') * 2] == '\\' ||
               pcVar2[(ulong)(cVar3 != '\0') * 2] == '/');
  }
  return local_28.size;
}

Assistant:

int mctools_path_is_absolute( const mcu8str* rawpath )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(rawpath);
    if ( path.size == 0 )
      return 0;
    if ( path.size >= 2
         && path.c_str[0] == '~'
         && ( path.c_str[1] == '/' || path.c_str[1] == '\\' ) )
      return 1;//leading "~/"
    const char * path_begin = path.c_str;
    if ( mctools_drive_letter( &path ) )
      path_begin += 2;
    if ( *path_begin == '/' || *path_begin == '\\' )
      return 1;
    return 0;
  }